

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_array_cmp_generic(void *a,void *b,void *opaque)

{
  JSContext *ctx;
  JSValue new_target;
  JSValueUnion JVar1;
  uint uVar2;
  int val;
  int iVar3;
  undefined1 auVar4 [16];
  JSValue JVar5;
  double val_1;
  JSValue argv [2];
  JSValueUnion local_58;
  undefined8 uStack_50;
  JSValueUnion local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  JVar5.tag = (int64_t)opaque;
  JVar5.u.float64 = local_48.float64;
  if (*(int *)((long)opaque + 8) != 0) {
    return 0;
  }
  ctx = *opaque;
  if (*(int *)((long)opaque + 0xc) == 0) {
    if (*(long *)((long)a + 0x10) == 0) {
      JVar5 = JS_ToStringInternal(ctx,*a,0);
      iVar3 = 3;
      if ((int)JVar5.tag != 6) {
        *(JSValueUnion *)((long)a + 0x10) = JVar5.u;
        iVar3 = 0;
      }
      if (iVar3 == 3) goto LAB_001680f2;
      if (iVar3 != 0) {
        return 0;
      }
    }
    local_48 = JVar5.u;
    if (*(long *)((long)b + 0x10) == 0) {
      JVar5 = JS_ToStringInternal(ctx,*b,0);
      iVar3 = 3;
      if ((int)JVar5.tag != 6) {
        *(JSValueUnion *)((long)b + 0x10) = JVar5.u;
        iVar3 = 0;
      }
      if (iVar3 == 3) goto LAB_001680f2;
      if (iVar3 != 0) {
        return 0;
      }
    }
    local_48 = JVar5.u;
    uVar2 = js_string_compare(*(JSContext **)((long)a + 0x10),*(JSString **)((long)b + 0x10),
                              (JSString *)JVar5.tag);
  }
  else {
    auVar4[0] = -(*b == *a);
    auVar4[1] = -(*(char *)((long)b + 1) == *(char *)((long)a + 1));
    auVar4[2] = -(*(char *)((long)b + 2) == *(char *)((long)a + 2));
    auVar4[3] = -(*(char *)((long)b + 3) == *(char *)((long)a + 3));
    auVar4[4] = -(*(char *)((long)b + 4) == *(char *)((long)a + 4));
    auVar4[5] = -(*(char *)((long)b + 5) == *(char *)((long)a + 5));
    auVar4[6] = -(*(char *)((long)b + 6) == *(char *)((long)a + 6));
    auVar4[7] = -(*(char *)((long)b + 7) == *(char *)((long)a + 7));
    auVar4[8] = -(*(char *)((long)b + 8) == *(char *)((long)a + 8));
    auVar4[9] = -(*(char *)((long)b + 9) == *(char *)((long)a + 9));
    auVar4[10] = -(*(char *)((long)b + 10) == *(char *)((long)a + 10));
    auVar4[0xb] = -(*(char *)((long)b + 0xb) == *(char *)((long)a + 0xb));
    auVar4[0xc] = -(*(char *)((long)b + 0xc) == *(char *)((long)a + 0xc));
    auVar4[0xd] = -(*(char *)((long)b + 0xd) == *(char *)((long)a + 0xd));
    auVar4[0xe] = -(*(char *)((long)b + 0xe) == *(char *)((long)a + 0xe));
    auVar4[0xf] = -(*(char *)((long)b + 0xf) == *(char *)((long)a + 0xf));
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        == 0xffff) goto LAB_00167ff6;
    local_48 = *a;
    uStack_40 = *(undefined8 *)((long)a + 8);
    local_38 = *b;
    uStack_30 = *(undefined8 *)((long)b + 8);
    local_58.float64 = local_58.float64 & 0xffffffff00000000;
    uStack_50 = 3;
    new_target.tag = 3;
    new_target.u.float64 = local_58.float64;
    JVar5 = JS_CallInternal(ctx,*(JSValue *)((long)opaque + 0x10),(JSValue)(ZEXT816(3) << 0x40),
                            new_target,2,(JSValue *)&local_48,2);
    uVar2 = (uint)JVar5.tag;
    if (uVar2 == 6) goto LAB_001680f2;
    iVar3 = JVar5.u._0_4_;
    if (uVar2 == 0) {
      uVar2 = (uint)(iVar3 != 0) | iVar3 >> 0x1f;
      goto LAB_00167fec;
    }
    if (uVar2 < 3) {
      JVar1.float64 = (double)iVar3;
LAB_001680c1:
      local_58 = JVar1;
      uVar2 = (uint)(0.0 < local_58.float64) - (uint)(local_58.float64 < 0.0);
      iVar3 = 0;
    }
    else {
      JVar1 = JVar5.u;
      if ((uVar2 == 7) ||
         (uVar2 = __JS_ToFloat64Free(ctx,&local_58.float64,JVar5), JVar1 = local_58, -1 < (int)uVar2
         )) goto LAB_001680c1;
      iVar3 = 3;
    }
    if (iVar3 != 0) {
      if (iVar3 != 3) {
        return 0;
      }
LAB_001680f2:
      *(undefined4 *)((long)opaque + 8) = 1;
      return 0;
    }
  }
LAB_00167fec:
  if (uVar2 != 0) {
    return uVar2;
  }
LAB_00167ff6:
  return (uint)(*(long *)((long)b + 0x18) < *(long *)((long)a + 0x18)) -
         (uint)(*(long *)((long)a + 0x18) < *(long *)((long)b + 0x18));
}

Assistant:

static int js_array_cmp_generic(const void *a, const void *b, void *opaque) {
    struct array_sort_context *psc = opaque;
    JSContext *ctx = psc->ctx;
    JSValueConst argv[2];
    JSValue res;
    ValueSlot *ap = (ValueSlot *)(void *)a;
    ValueSlot *bp = (ValueSlot *)(void *)b;
    int cmp;

    if (psc->exception)
        return 0;

    if (psc->has_method) {
        /* custom sort function is specified as returning 0 for identical
         * objects: avoid method call overhead.
         */
        if (!memcmp(&ap->val, &bp->val, sizeof(ap->val)))
            goto cmp_same;
        argv[0] = ap->val;
        argv[1] = bp->val;
        res = JS_Call(ctx, psc->method, JS_UNDEFINED, 2, argv);
        if (JS_IsException(res))
            goto exception;
        if (JS_VALUE_GET_TAG(res) == JS_TAG_INT) {
            int val = JS_VALUE_GET_INT(res);
            cmp = (val > 0) - (val < 0);
        } else {
            double val;
            if (JS_ToFloat64Free(ctx, &val, res) < 0)
                goto exception;
            cmp = (val > 0) - (val < 0);
        }
    } else {
        /* Not supposed to bypass ToString even for identical objects as
         * tested in test262/test/built-ins/Array/prototype/sort/bug_596_1.js
         */
        if (!ap->str) {
            JSValue str = JS_ToString(ctx, ap->val);
            if (JS_IsException(str))
                goto exception;
            ap->str = JS_VALUE_GET_STRING(str);
        }
        if (!bp->str) {
            JSValue str = JS_ToString(ctx, bp->val);
            if (JS_IsException(str))
                goto exception;
            bp->str = JS_VALUE_GET_STRING(str);
        }
        cmp = js_string_compare(ctx, ap->str, bp->str);
    }
    if (cmp != 0)
        return cmp;
cmp_same:
    /* make sort stable: compare array offsets */
    return (ap->pos > bp->pos) - (ap->pos < bp->pos);

exception:
    psc->exception = 1;
    return 0;
}